

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

void OptimizeModule(CompilerContext *ctx)

{
  ExpressionContext *ctx_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  VmModule *pVVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  VmFunction *function;
  bool bVar18;
  TraceScope traceScope;
  TraceScope traceScope_2;
  TraceScope local_50;
  TraceScope local_40;
  
  uVar16 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar16;
  (ctx->statistics).finishTime = 0;
  function = (ctx->vmModule->functions).head;
  if (function != (VmFunction *)0x0) {
    ctx_00 = &ctx->exprCtx;
    do {
      if (function->firstBlock != (VmBlock *)0x0) {
        iVar17 = ctx->optimizationLevel;
        if (iVar17 == 0) {
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
          iVar17 = ctx->optimizationLevel;
        }
        if (0 < iVar17) {
          if ((OptimizeModule(CompilerContext&)::token == '\0') &&
             (iVar17 = __cxa_guard_acquire(&OptimizeModule(CompilerContext&)::token), iVar17 != 0))
          {
            OptimizeModule::token = NULLC::TraceGetToken("compiler","OptimizationLevel1");
            __cxa_guard_release(&OptimizeModule(CompilerContext&)::token);
          }
          NULLC::TraceScope::TraceScope(&local_50,OptimizeModule::token);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_PEEPHOLE);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_CONSTANT_PROPAGATION);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_LOAD_STORE_PROPAGATION);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_ARRAY_TO_ELEMENTS);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
          NULLC::TraceScope::~TraceScope(&local_50);
        }
        RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_LEGALIZE_ARRAY_VALUES);
        if (1 < ctx->optimizationLevel) {
          if ((OptimizeModule(CompilerContext&)::token == '\0') &&
             (iVar17 = __cxa_guard_acquire(&OptimizeModule(CompilerContext&)::token), iVar17 != 0))
          {
            OptimizeModule(CompilerContext&)::token =
                 NULLC::TraceGetToken("compiler","OptimizationLevel2");
            __cxa_guard_release(&OptimizeModule(CompilerContext&)::token);
          }
          NULLC::TraceScope::TraceScope(&local_50,OptimizeModule(CompilerContext&)::token);
          uVar16 = 0;
          do {
            if ((OptimizeModule(CompilerContext&)::token == '\0') &&
               (iVar17 = __cxa_guard_acquire(&OptimizeModule(CompilerContext&)::token), iVar17 != 0)
               ) {
              OptimizeModule(CompilerContext&)::token = NULLC::TraceGetToken("compiler","iteration")
              ;
              __cxa_guard_release(&OptimizeModule(CompilerContext&)::token);
            }
            NULLC::TraceScope::TraceScope(&local_40,OptimizeModule(CompilerContext&)::token);
            pVVar11 = ctx->vmModule;
            uVar1 = pVVar11->constantPropagations;
            uVar2 = pVVar11->peepholeOptimizations;
            uVar3 = pVVar11->deadCodeEliminations;
            uVar4 = pVVar11->controlFlowSimplifications;
            uVar5 = pVVar11->loadStorePropagations;
            uVar6 = pVVar11->commonSubexprEliminations;
            uVar7 = pVVar11->deadAllocaStoreEliminations;
            RunVmPass(ctx_00,pVVar11,function,VM_PASS_OPT_CONSTANT_PROPAGATION);
            RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_LOAD_STORE_PROPAGATION);
            RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION);
            RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_PEEPHOLE);
            RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
            RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION);
            RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
            RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION);
            pVVar11 = ctx->vmModule;
            uVar12 = pVVar11->peepholeOptimizations;
            uVar13 = pVVar11->constantPropagations;
            uVar14 = pVVar11->deadCodeEliminations;
            uVar15 = pVVar11->controlFlowSimplifications;
            uVar8 = pVVar11->loadStorePropagations;
            uVar9 = pVVar11->commonSubexprEliminations;
            uVar10 = pVVar11->deadAllocaStoreEliminations;
            NULLC::TraceScope::~TraceScope(&local_40);
          } while ((uVar1 + uVar2 + uVar3 + uVar4 + uVar5 + uVar6 + uVar7 !=
                    uVar9 + uVar10 + uVar15 + uVar13 + uVar14 + uVar12 + uVar8) &&
                  (bVar18 = uVar16 < 5, uVar16 = uVar16 + 1, bVar18));
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_MEMORY_TO_REGISTER);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_LATE_PEEPHOLE);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_CODE_ELIMINATION);
          RunVmPass(ctx_00,ctx->vmModule,function,VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION);
          NULLC::TraceScope::~TraceScope(&local_50);
        }
      }
      function = function->next;
    } while (function != (VmFunction *)0x0);
  }
  uVar16 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(&ctx->statistics,"IrOptimization",uVar16);
  return;
}

Assistant:

void OptimizeModule(CompilerContext &ctx)
{
	ExpressionContext &exprCtx = ctx.exprCtx;

	ctx.statistics.Start(NULLCTime::clockMicro());

	for(VmFunction *function = ctx.vmModule->functions.head; function; function = function->next)
	{
		if(!function->firstBlock)
			continue;

		// Dead code elimination is required for correct register allocation
		if(ctx.optimizationLevel == 0)
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);

		if(ctx.optimizationLevel >= 1)
		{
			TRACE_SCOPE("compiler", "OptimizationLevel1");

			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_PEEPHOLE);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_CONSTANT_PROPAGATION);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_LOAD_STORE_PROPAGATION);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_ARRAY_TO_ELEMENTS);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);
		}

		RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_LEGALIZE_ARRAY_VALUES);

		if(ctx.optimizationLevel >= 2)
		{
			TRACE_SCOPE("compiler", "OptimizationLevel2");

			for(unsigned i = 0; i < 6; i++)
			{
				TRACE_SCOPE("compiler", "iteration");

				unsigned before = ctx.vmModule->peepholeOptimizations + ctx.vmModule->constantPropagations + ctx.vmModule->deadCodeEliminations + ctx.vmModule->controlFlowSimplifications + ctx.vmModule->loadStorePropagations + ctx.vmModule->commonSubexprEliminations + ctx.vmModule->deadAllocaStoreEliminations;

				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_CONSTANT_PROPAGATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_LOAD_STORE_PROPAGATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_COMMON_SUBEXPRESSION_ELIMINATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_PEEPHOLE);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_CONTROL_FLOW_SIPLIFICATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);
				RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION);

				unsigned after = ctx.vmModule->peepholeOptimizations + ctx.vmModule->constantPropagations + ctx.vmModule->deadCodeEliminations + ctx.vmModule->controlFlowSimplifications + ctx.vmModule->loadStorePropagations + ctx.vmModule->commonSubexprEliminations + ctx.vmModule->deadAllocaStoreEliminations;

				// Reached fixed point
				if(before == after)
					break;
			}

			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_MEMORY_TO_REGISTER);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);

			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_LATE_PEEPHOLE);
			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_CODE_ELIMINATION);

			RunVmPass(exprCtx, ctx.vmModule, function, VM_PASS_OPT_DEAD_ALLOCA_STORE_ELIMINATION);
		}
	}

	ctx.statistics.Finish("IrOptimization", NULLCTime::clockMicro());
}